

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManPrint(Tim_Man_t *p)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  Tim_Obj_t *pTVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Vec_Ptr_t *pVVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  
  if (p == (Tim_Man_t *)0x0) {
    return;
  }
  puts("TIMING MANAGER:");
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
    uVar7 = p->nCis;
  }
  else {
    uVar7 = Tim_ManBoxOutputFirst(p,0);
  }
  uVar3 = p->nCis;
  uVar8 = Tim_ManPoNum(p);
  uVar16 = 0;
  uVar14 = 0;
  if (p->vBoxes != (Vec_Ptr_t *)0x0) {
    uVar14 = (ulong)(uint)p->vBoxes->nSize;
  }
  printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar7,(ulong)uVar3,(ulong)uVar8,
         (ulong)(uint)p->nCos,uVar14);
  pTVar5 = p->pCis;
  uVar7 = p->nCis;
  if (0 < (int)uVar7) {
    pfVar12 = &pTVar5->timeReq;
    uVar16 = 0;
    do {
      if ((pTVar5 == (Tim_Obj_t *)0x0) ||
         (((int)pfVar12[-3] < 0 &&
          ((((pTVar5->timeArr != pfVar12[-1] || (NAN(pTVar5->timeArr) || NAN(pfVar12[-1]))) ||
            (pTVar5->timeReq != *pfVar12)) || (NAN(pTVar5->timeReq) || NAN(*pfVar12)))))))
      goto LAB_0049e1ac;
      uVar16 = uVar16 + 1;
      pfVar12 = pfVar12 + 6;
    } while (uVar7 != uVar16);
    uVar16 = (ulong)uVar7;
  }
LAB_0049e1ac:
  if ((uint)uVar16 == uVar7) {
    printf("All PIs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar5->timeArr,
           (double)pTVar5->timeReq);
  }
  else if (0 < p->nCis) {
    lVar13 = 0x14;
    uVar14 = 0;
    do {
      pTVar5 = p->pCis;
      if (pTVar5 == (Tim_Obj_t *)0x0) break;
      if (*(int *)((long)pTVar5 + lVar13 + -0xc) < 0) {
        printf("PI%5d     :  arrival = %5.3f  required = %5.3f\n",
               (double)*(float *)((long)pTVar5 + lVar13 + -4),
               (double)*(float *)((long)&pTVar5->Id + lVar13),uVar14 & 0xffffffff);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x18;
    } while ((long)uVar14 < (long)p->nCis);
  }
  pTVar5 = p->pCos;
  uVar7 = p->nCos;
  if ((int)uVar7 < 1) {
    uVar14 = 0;
  }
  else {
    pfVar12 = &pTVar5->timeReq;
    uVar14 = 0;
    do {
      if ((pTVar5 == (Tim_Obj_t *)0x0) ||
         (((int)pfVar12[-3] < 0 &&
          (((pTVar5->timeArr != pfVar12[-1] || (NAN(pTVar5->timeArr) || NAN(pfVar12[-1]))) ||
           ((pTVar5->timeReq != *pfVar12 || (NAN(pTVar5->timeReq) || NAN(*pfVar12)))))))))
      goto LAB_0049e279;
      uVar14 = uVar14 + 1;
      pfVar12 = pfVar12 + 6;
    } while (uVar7 != uVar14);
    uVar14 = (ulong)uVar7;
  }
LAB_0049e279:
  if ((uint)uVar14 == uVar7) {
    printf("All POs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar5->timeArr,
           (double)pTVar5->timeReq);
  }
  else if (0 < p->nCos) {
    lVar13 = 0;
    lVar17 = 0x14;
    uVar14 = 0;
    do {
      pTVar5 = p->pCos;
      if (pTVar5 == (Tim_Obj_t *)0x0) break;
      if (*(int *)((long)pTVar5 + lVar17 + -0xc) < 0) {
        printf("PO%5d     :  arrival = %5.3f  required = %5.3f\n",
               (double)*(float *)((long)pTVar5 + lVar17 + -4),
               (double)*(float *)((long)&pTVar5->Id + lVar17),uVar14);
        uVar14 = (ulong)((int)uVar14 + 1);
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar13 < p->nCos);
  }
  if (((p->vBoxes != (Vec_Ptr_t *)0x0) && (0 < p->vBoxes->nSize)) &&
     (pVVar11 = p->vBoxes, 0 < pVVar11->nSize)) {
    uVar14 = 0;
    do {
      piVar6 = (int *)pVVar11->pArray[uVar14];
      uVar7 = piVar6[2];
      uVar3 = piVar6[3];
      uVar8 = Tim_ManBoxInputFirst(p,(int)uVar14);
      uVar9 = Tim_ManBoxOutputFirst(p,(int)uVar14);
      printf("*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n",uVar14 & 0xffffffff,
             (ulong)uVar7,(ulong)uVar3,(ulong)uVar8,(ulong)uVar9,piVar6[4]);
      uVar7 = piVar6[2];
      if ((int)uVar7 < 1) {
        __assert_fail("i < pBox->nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timInt.h"
                      ,100,"Tim_Obj_t *Tim_ManBoxInput(Tim_Man_t *, Tim_Box_t *, int)");
      }
      pTVar5 = p->pCos;
      iVar4 = piVar6[7];
      uVar16 = 0;
      do {
        if (pTVar5 == (Tim_Obj_t *)0x0) goto LAB_0049e3c0;
        if ((((pTVar5[iVar4].timeArr != pTVar5[piVar6[uVar16 + 7]].timeArr) ||
             (NAN(pTVar5[iVar4].timeArr) || NAN(pTVar5[piVar6[uVar16 + 7]].timeArr))) ||
            (pTVar5[iVar4].timeReq != pTVar5[piVar6[uVar16 + 7]].timeReq)) ||
           (NAN(pTVar5[iVar4].timeReq) || NAN(pTVar5[piVar6[uVar16 + 7]].timeReq)))
        goto LAB_0049e3c0;
        uVar16 = uVar16 + 1;
      } while (uVar7 != uVar16);
      uVar16 = (ulong)uVar7;
LAB_0049e3c0:
      iVar10 = Tim_ManBoxInputNum(p,*piVar6);
      if ((int)uVar16 == iVar10) {
        printf("Box inputs  :  arrival = %5.3f  required = %5.3f\n",(double)pTVar5[iVar4].timeArr,
               (double)pTVar5[iVar4].timeReq);
      }
      else if (0 < piVar6[2]) {
        uVar16 = 0;
        do {
          pTVar5 = p->pCos;
          if (pTVar5 == (Tim_Obj_t *)0x0) break;
          printf("box-in%4d :  arrival = %5.3f  required = %5.3f\n",
                 (double)pTVar5[piVar6[uVar16 + 7]].timeArr,
                 (double)pTVar5[piVar6[uVar16 + 7]].timeReq,uVar16 & 0xffffffff);
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)piVar6[2]);
      }
      uVar7 = piVar6[3];
      if ((int)uVar7 < 1) {
        __assert_fail("i < pBox->nOutputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timInt.h"
                      ,0x65,"Tim_Obj_t *Tim_ManBoxOutput(Tim_Man_t *, Tim_Box_t *, int)");
      }
      pTVar5 = p->pCis;
      iVar4 = piVar6[(long)piVar6[2] + 7];
      uVar16 = 0;
      do {
        if (pTVar5 == (Tim_Obj_t *)0x0) goto LAB_0049e49f;
        iVar10 = (piVar6 + (long)piVar6[2] + 7)[uVar16];
        if (((pTVar5[iVar4].timeArr != pTVar5[iVar10].timeArr) ||
            (NAN(pTVar5[iVar4].timeArr) || NAN(pTVar5[iVar10].timeArr))) ||
           ((pTVar5[iVar4].timeReq != pTVar5[iVar10].timeReq ||
            (NAN(pTVar5[iVar4].timeReq) || NAN(pTVar5[iVar10].timeReq))))) goto LAB_0049e49f;
        uVar16 = uVar16 + 1;
      } while (uVar7 != uVar16);
      uVar16 = (ulong)uVar7;
LAB_0049e49f:
      iVar10 = Tim_ManBoxOutputNum(p,*piVar6);
      if ((int)uVar16 == iVar10) {
        printf("Box outputs :  arrival = %5.3f  required = %5.3f\n",(double)pTVar5[iVar4].timeArr,
               (double)pTVar5[iVar4].timeReq);
      }
      else if (0 < piVar6[3]) {
        uVar16 = 0;
        do {
          pTVar5 = p->pCis;
          if (pTVar5 == (Tim_Obj_t *)0x0) break;
          printf("box-out%3d :  arrival = %5.3f  required = %5.3f\n",
                 (double)pTVar5[piVar6[(long)piVar6[2] + uVar16 + 7]].timeArr,
                 (double)pTVar5[piVar6[(long)piVar6[2] + uVar16 + 7]].timeReq,uVar16 & 0xffffffff);
          uVar16 = uVar16 + 1;
        } while ((int)uVar16 < piVar6[3]);
      }
      if (uVar14 == 3) break;
      uVar14 = uVar14 + 1;
      pVVar11 = p->vBoxes;
    } while ((long)uVar14 < (long)pVVar11->nSize);
  }
  if (((p->vDelayTables != (Vec_Ptr_t *)0x0) && (0 < p->vDelayTables->nSize)) &&
     (pVVar11 = p->vDelayTables, 0 < pVVar11->nSize)) {
    uVar14 = 0;
    do {
      pfVar12 = (float *)pVVar11->pArray[uVar14];
      if (pfVar12 != (float *)0x0) {
        printf("Delay table %d:\n",uVar14 & 0xffffffff);
        if (uVar14 != (uint)(int)*pfVar12) {
          __assert_fail("i == (int)pTable[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x25d,"void Tim_ManPrint(Tim_Man_t *)");
        }
        fVar1 = pfVar12[2];
        if (0 < (int)fVar1) {
          uVar7 = (uint)pfVar12[1];
          pfVar12 = pfVar12 + 3;
          uVar16 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar15 = 0;
              do {
                fVar2 = pfVar12[uVar15];
                if ((fVar2 != -1e+09) || (NAN(fVar2))) {
                  printf("%5.0f",(double)fVar2);
                }
                else {
                  printf("%5s","-");
                }
                uVar15 = uVar15 + 1;
              } while (uVar7 != uVar15);
            }
            uVar16 = uVar16 + 1;
            putchar(10);
            pfVar12 = pfVar12 + uVar7;
          } while (uVar16 != (uint)(int)fVar1);
        }
      }
      uVar14 = uVar14 + 1;
      pVVar11 = p->vDelayTables;
    } while ((long)uVar14 < (long)pVVar11->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Tim_ManPrint( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj, * pPrev;
    float * pTable;
    int i, j, k, TableX, TableY;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    // print CI info
    pPrev = p->pCis;
    Tim_ManForEachPi( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCiNum(p) )
        printf( "All PIs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
        Tim_ManForEachPi( p, pObj, i )
            printf( "PI%5d     :  arrival = %5.3f  required = %5.3f\n", i, pObj->timeArr, pObj->timeReq );

    // print CO info
    pPrev = p->pCos;
    Tim_ManForEachPo( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCoNum(p) )
        printf( "All POs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
    {
        int k = 0;
        Tim_ManForEachPo( p, pObj, i )
            printf( "PO%5d     :  arrival = %5.3f  required = %5.3f\n", k++, pObj->timeArr, pObj->timeReq );
    }

    // print box info
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        printf( "*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n", 
            i, pBox->nInputs, pBox->nOutputs, 
            Tim_ManBoxInputFirst(p, i), Tim_ManBoxOutputFirst(p, i), 
            pBox->iDelayTable );

        // print box inputs
        pPrev = Tim_ManBoxInput( p, pBox, 0 );
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxInputNum(p, pBox->iBox) )
            printf( "Box inputs  :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachInput( p, pBox, pObj, k )
                printf( "box-in%4d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        // print box outputs
        pPrev = Tim_ManBoxOutput( p, pBox, 0 );
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxOutputNum(p, pBox->iBox) )
            printf( "Box outputs :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachOutput( p, pBox, pObj, k )
                printf( "box-out%3d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        if ( i > 2 )
            break;
    }

    // print delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pTable, i )
    {
        if ( pTable == NULL )
            continue;
        printf( "Delay table %d:\n", i );
        assert( i == (int)pTable[0] );
        TableX = (int)pTable[1];
        TableY = (int)pTable[2];
        for ( j = 0; j < TableY; j++, printf( "\n" ) )
            for ( k = 0; k < TableX; k++ )
                if ( pTable[3+j*TableX+k] == -ABC_INFINITY )
                    printf( "%5s", "-" );
                else
                    printf( "%5.0f", pTable[3+j*TableX+k] );
    }
    printf( "\n" );
}